

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O2

MPP_RET camera_source_deinit(CamSource *ctx)

{
  MppBuffer pvVar1;
  ulong uVar2;
  RK_S32 *pRVar3;
  ulong uVar4;
  v4l2_buf_type type;
  v4l2_buffer buf;
  v4l2_buf_type local_8c;
  uint local_88;
  v4l2_buf_type local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if ((ctx != (CamSource *)0x0) && (-1 < ctx->fd)) {
    local_8c = ctx->type;
    camera_source_ioctl(ctx->fd,0x40045613,&local_8c);
    pRVar3 = &ctx->fbuf[0].export_fd;
    for (uVar4 = 0; uVar4 < ctx->bufcnt; uVar4 = uVar4 + 1) {
      local_40 = 0;
      uStack_38 = 0;
      uStack_48 = 0;
      local_60 = 0;
      uStack_58 = 0;
      local_70 = 0;
      uStack_68 = 0;
      local_80 = 0;
      uStack_78 = 0;
      local_84 = local_8c;
      local_50 = 0x100000000;
      local_88 = (uint)uVar4;
      camera_source_ioctl(ctx->fd,-0x3fa7a9f7,&local_88);
      uVar2 = (ulong)local_88;
      pvVar1 = ctx->fbuf[uVar2].buffer;
      if (pvVar1 != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(pvVar1,"camera_source_deinit");
        uVar2 = (ulong)local_88;
      }
      munmap(ctx->fbuf[uVar2].start,ctx->fbuf[uVar2].length);
      close(*pRVar3);
      pRVar3 = pRVar3 + 8;
    }
    close(ctx->fd);
    mpp_osal_free("camera_source_deinit",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET camera_source_deinit(CamSource *ctx)
{
    struct v4l2_buffer buf;
    enum v4l2_buf_type type;
    RK_U32 i;

    if (NULL == ctx)
        return MPP_OK;

    if (ctx->fd < 0)
        return MPP_OK;

    // Stop capturing
    type = ctx->type;

    camera_source_ioctl(ctx->fd, VIDIOC_STREAMOFF, &type);

    // un-mmap() buffers
    for (i = 0 ; i < ctx->bufcnt; i++) {
        buf = (struct v4l2_buffer) {0};
        buf.type    = type;
        buf.memory  = V4L2_MEMORY_MMAP;
        buf.index   = i;
        camera_source_ioctl(ctx->fd, VIDIOC_QUERYBUF, &buf);
        if (ctx->fbuf[buf.index].buffer) {
            mpp_buffer_put(ctx->fbuf[buf.index].buffer);
        }
        munmap(ctx->fbuf[buf.index].start, ctx->fbuf[buf.index].length);
        close(ctx->fbuf[i].export_fd);
    }

    // Close v4l2 device
    close(ctx->fd);
    MPP_FREE(ctx);
    return MPP_OK;
}